

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

MachineConfiguration * MT32Emu::findMachineConfiguration(char *machine_id)

{
  int iVar1;
  ulong in_RAX;
  MachineConfiguration **ppMVar2;
  char *__s1;
  ulong uVar3;
  Bit32u configurationCount;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ppMVar2 = MachineConfiguration::getAllMachineConfigurations((Bit32u *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ != 0) {
    uVar3 = 0;
    do {
      __s1 = MachineConfiguration::getMachineID(ppMVar2[uVar3]);
      iVar1 = strcmp(__s1,machine_id);
      if (iVar1 == 0) {
        return ppMVar2[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uStack_28 >> 0x20);
  }
  return (MachineConfiguration *)0x0;
}

Assistant:

static const MachineConfiguration *findMachineConfiguration(const char *machine_id) {
	Bit32u configurationCount;
	const MachineConfiguration * const *configurations = MachineConfiguration::getAllMachineConfigurations(&configurationCount);
	for (Bit32u i = 0; i < configurationCount; i++) {
		if (!strcmp(configurations[i]->getMachineID(), machine_id)) return configurations[i];
	}
	return NULL;
}